

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void __thiscall test_solvers_4x5::test_method(test_solvers_4x5 *this)

{
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> _Stack_118;
  matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  local_100;
  size_t expected_assignment [4];
  double costs [20];
  
  memcpy(costs,&DAT_0011c9c0,0xa0);
  expected_assignment[2] = 3;
  expected_assignment[3] = 4;
  expected_assignment[0] = 0;
  expected_assignment[1] = 2;
  make_matrix<double>(&local_100,costs,4,5);
  make_vector<unsigned_long>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&_Stack_118,
             expected_assignment,4);
  assert_solvers_result<double>
            (&local_100,31.0,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&_Stack_118);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&_Stack_118);
  boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>::~unbounded_array
            (&local_100.data_);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_solvers_4x5)
{
  const double costs[] = {10, 19, 8, 15, 0,
                          10, 18, 7, 17, 0,
                          13, 16, 9, 14, 0,
                          12, 19, 8, 18, 0};
  const std::size_t expected_assignment[] = {0, 2, 3, 4};
  assert_solvers_result(make_matrix(costs, 4, 5), 31.0, make_vector(expected_assignment, 4));
}